

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t validation_layer::zeCommandListReset(ze_command_list_handle_t hCommandList)

{
  Logger *this;
  code *pcVar1;
  long *plVar2;
  long lVar3;
  ze_result_t result;
  ze_result_t zVar4;
  size_t i;
  long lVar5;
  long lVar6;
  size_t i_1;
  allocator local_51;
  string local_50;
  
  lVar3 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string((string *)&local_50,"zeCommandListReset(hCommandList)",&local_51);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = *(code **)(lVar3 + 0x238);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar3 + 0xd38) - *(long *)(lVar3 + 0xd30) >> 3;
    lVar5 = 0;
    do {
      if (lVar6 == lVar5) {
        if ((*(char *)(lVar3 + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeCommandListResetPrologue
                               (*(ZEHandleLifetimeValidation **)(lVar3 + 0xd48),hCommandList),
           result == ZE_RESULT_SUCCESS)) {
          zVar4 = (*pcVar1)(hCommandList);
          lVar5 = 0;
          goto LAB_0014ae87;
        }
        break;
      }
      plVar2 = (long *)**(undefined8 **)(*(long *)(lVar3 + 0xd30) + lVar5 * 8);
      result = (**(code **)(*plVar2 + 0x270))(plVar2,hCommandList);
      lVar5 = lVar5 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_0014aeb2;
  while( true ) {
    plVar2 = (long *)**(undefined8 **)(*(long *)(lVar3 + 0xd30) + lVar5 * 8);
    result = (**(code **)(*plVar2 + 0x278))(plVar2,hCommandList,zVar4);
    lVar5 = lVar5 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_0014ae87:
    result = zVar4;
    if (lVar6 == lVar5) break;
  }
LAB_0014aeb2:
  logAndPropagateResult("zeCommandListReset",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListReset(
        ze_command_list_handle_t hCommandList           ///< [in] handle of command list object to reset
        )
    {
        context.logger->log_trace("zeCommandListReset(hCommandList)");

        auto pfnReset = context.zeDdiTable.CommandList.pfnReset;

        if( nullptr == pfnReset )
            return logAndPropagateResult("zeCommandListReset", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListResetPrologue( hCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListReset", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListResetPrologue( hCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListReset", result);
        }

        auto driver_result = pfnReset( hCommandList );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListResetEpilogue( hCommandList ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListReset", result);
        }

        return logAndPropagateResult("zeCommandListReset", driver_result);
    }